

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::draw_action(Application *this)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  OSDText *this_00;
  char *pcVar6;
  stringstream actionString;
  stringstream lbs_string;
  stringstream damping_string;
  stringstream timestep_string;
  stringstream integrator_string;
  float local_8b0;
  float local_8ac;
  Color local_8a8;
  OSDText *local_890;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  Color local_7e8;
  stringstream local_7d8 [16];
  ostream local_7c8 [112];
  ios_base local_758 [264];
  stringstream local_650 [16];
  ostream local_640 [112];
  ios_base aiStack_5d0 [264];
  stringstream local_4c8 [16];
  ostream local_4b8 [112];
  ios_base aiStack_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  iVar1 = *(int *)&(this->super_Renderer).field_0xc;
  if (iVar1 != 0) {
    if (iVar1 != 2) {
      return;
    }
    bVar3 = Timeline::isCurrentlyPlaying(&this->timeline);
    if (bVar3) {
      return;
    }
  }
  this_00 = &this->textManager;
  OSDText::clear(this_00);
  piVar2 = (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar2) {
    (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_8ac = 48.0;
  local_8b0 = 48.0;
  if ((this->super_Renderer).use_hdpi == false) {
    local_8b0 = 24.0;
  }
  else {
    local_8ac = 112.0;
  }
  std::__cxx11::stringstream::stringstream(local_7d8);
  std::__ostream_insert<char,std::char_traits<char>>(local_7c8,"ACTION: ",8);
  uVar4 = (ulong)this->action;
  if (uVar4 < 9) {
    pcVar6 = &DAT_001e505c + *(int *)(&DAT_001e505c + uVar4 * 4);
    lVar5 = *(long *)(&DAT_001e5080 + uVar4 * 8);
  }
  else {
    lVar5 = 6;
    pcVar6 = "(none)";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_7c8,pcVar6,lVar5);
  local_7e8.r = 0.3;
  local_7e8.g = 0.7;
  local_7e8.b = 0.3;
  local_7e8.a = 1.0;
  std::__cxx11::stringbuf::str();
  draw_string(this,local_8b0,local_8ac,&local_808,0x10,&local_7e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  if (*(int *)&(this->super_Renderer).field_0xc != 2) goto LAB_00188879;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Integrator: ",0xc);
  if (this->integrator == Forward_Euler) {
    lVar5 = 0xd;
    pcVar6 = "Forward Euler";
LAB_001885b3:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,lVar5);
  }
  else if (this->integrator == Symplectic_Euler) {
    lVar5 = 0x10;
    pcVar6 = "Symplectic Euler";
    goto LAB_001885b3;
  }
  local_8a8.r = 0.7;
  local_8a8.g = 0.3;
  local_8a8.b = 0.7;
  local_8a8.a = 1.0;
  std::__cxx11::stringbuf::str();
  draw_string(this,local_8b0,local_8ac + 20.0,&local_828,0x10,&local_8a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  local_890 = this_00;
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"Timestep: ",10);
  std::ostream::_M_insert<double>(this->timestep);
  std::__cxx11::stringbuf::str();
  draw_string(this,local_8b0,local_8ac + 40.0,&local_848,0x10,&local_8a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__ostream_insert<char,std::char_traits<char>>(local_4b8,"Damping Factor: ",0x10);
  std::ostream::_M_insert<double>(this->damping_factor);
  std::__cxx11::stringbuf::str();
  draw_string(this,local_8b0,local_8ac + 60.0,&local_868,0x10,&local_8a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream(local_650);
  std::__ostream_insert<char,std::char_traits<char>>(local_640,"Linear Blend Skinning: ",0x17);
  pcVar6 = "Naive";
  if (this->useCapsuleRadius != false) {
    pcVar6 = "Threshold";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_640,pcVar6,(ulong)this->useCapsuleRadius * 4 + 5);
  std::__cxx11::stringbuf::str();
  draw_string(this,local_8b0,local_8ac + 80.0,&local_888,0x10,&local_8a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_650);
  std::ios_base::~ios_base(aiStack_5d0);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(aiStack_448);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  this_00 = local_890;
LAB_00188879:
  OSDText::render(this_00);
  std::__cxx11::stringstream::~stringstream(local_7d8);
  std::ios_base::~ios_base(local_758);
  return;
}

Assistant:

void Application::draw_action()
{
   if( mode != MODEL_MODE && mode != ANIMATE_MODE ) return;
   if (mode == ANIMATE_MODE && timeline.isCurrentlyPlaying()) return;

  textManager.clear();
  messages.clear();

  const size_t size = 16;
  const float x0 = use_hdpi ? 48 : 24;
  const float y0 = use_hdpi ? 80 : 40;
  const int inc  = use_hdpi ? 48  : 24;
  float y = y0 + inc - size;

  stringstream actionString;
  actionString << "ACTION: ";
  switch( action )
  {
     case( Action::Navigate ):
        actionString << "Navigate";
        break;
     case( Action::Edit ):
        actionString << "Edit";
        break;
     case( Action::Bevel ):
        actionString << "Bevel";
        break;
     case ( Action::CreateJoint):
        actionString << "Create Joint";
        break;
     case ( Action::Wave ):
        actionString << "Wave";
        break;
     case ( Action::Object ):
        actionString << "Object Transformation";
        break;
     case ( Action::Pose ):
        actionString << "Pose";
        break;
     case ( Action::IK ):
        actionString << "Inverse Kinematics";
        break;
     case ( Action::BoneRadius ):
        actionString << "Change Threshold Radius";
        break;
     default:
        actionString << "(none)";
        break;
  };



  Color action_color(0.3, .7, 0.3);
  draw_string( x0, y, actionString.str(), size, action_color );

  if (mode == ANIMATE_MODE) {
    stringstream integrator_string;
    integrator_string << "Integrator: ";
    switch (integrator) {
      case Integrator::Forward_Euler:
        integrator_string << "Forward Euler";
        break;
      case Integrator::Symplectic_Euler:
        integrator_string << "Symplectic Euler";
        break;
    }
    Color integrator_color(0.7, 0.3, 0.7);
    draw_string(x0, y + 20, integrator_string.str(), size, integrator_color);
    stringstream timestep_string;
    timestep_string << "Timestep: " << timestep;
    draw_string(x0, y + 40, timestep_string.str(), size, integrator_color);
    stringstream damping_string;
    damping_string << "Damping Factor: " << damping_factor;
    draw_string(x0, y + 60, damping_string.str(), size, integrator_color);
    stringstream lbs_string;
    lbs_string << "Linear Blend Skinning: " << (useCapsuleRadius? "Threshold" : "Naive");
    draw_string(x0, y + 80, lbs_string.str(), size, integrator_color);
  }

  // // No selection --> no messages.
  // if (!scene->has_selection()) {
  //   draw_string(x0, y, "No mesh feature is selected", size, text_color);
  //   y += inc;
  // } else {
  //   DynamicScene::SelectionInfo selectionInfo = scene->get_selection_info();
  //   for (const string& s : selectionInfo) {
  //     size_t split = s.find_first_of(":");
  //     if (split != string::npos) {
  //       split++;
  //       string s1 = s.substr(0,split);
  //       string s2 = s.substr(split);
  //       draw_string(x0, y, s1, size, text_color);
  //       draw_string(x0 + (use_hdpi ? 150 : 75 ), y, s2, size, text_color);
  //     } else {
  //       draw_string(x0, y, s, size, text_color);
  //     }
  //     y += inc;
  //   }
  // }

  // // -- First draw a lovely black rectangle.

  // glPushAttrib(GL_VIEWPORT_BIT);
  // glViewport(0, 0, screenW, screenH);

  // glMatrixMode(GL_PROJECTION);
  // glPushMatrix();
  // glLoadIdentity();
  // glOrtho(0, screenW, screenH, 0, 0, 1);

  // glMatrixMode(GL_MODELVIEW);
  // glPushMatrix();
  // glLoadIdentity();
  // glTranslatef(0, 0, -1);

  // // -- Black with opacity .8;

  // glColor4f(0.0, 0.0, 0.0, 0.8);

  // float min_x = x0 - 32;
  // float min_y = y0 - 32;
  // float max_x = screenW;
  // float max_y = y;

  // float z = 0.0;

  // glDisable(GL_DEPTH_TEST);
  // glDisable(GL_LIGHTING);

  // glBegin(GL_QUADS);

  // glVertex3f(min_x, min_y, z);
  // glVertex3f(min_x, max_y, z);
  // glVertex3f(max_x, max_y, z);
  // glVertex3f(max_x, min_y, z);
  // glEnd();

  // glMatrixMode(GL_PROJECTION);
  // glPopMatrix();

  // glMatrixMode(GL_MODELVIEW);
  // glPopMatrix();

  // glPopAttrib();

  // glEnable(GL_LIGHTING);
  // glEnable(GL_DEPTH_TEST);

  textManager.render();
}